

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O2

void __thiscall
CTxMemPool::UpdateTransactionsFromBlock
          (CTxMemPool *this,vector<uint256,_std::allocator<uint256>_> *vHashesToUpdate)

{
  type *this_00;
  long lVar1;
  pointer puVar2;
  bool bVar3;
  iterator updateIt;
  iterator iVar4;
  iterator child;
  size_type sVar5;
  _Base_ptr p_Var6;
  uint256 *k;
  __normal_iterator<const_uint256_*,_std::vector<uint256,_std::allocator<uint256>_>_> __tmp;
  pointer k_00;
  long in_FS_OFFSET;
  optional<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
  oVar7;
  Guard epoch_guard_5;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> descendants_to_remove;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> setAlreadyIncluded;
  cacheMap mapMemPoolDescendantsToUpdate;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  mapMemPoolDescendantsToUpdate._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &mapMemPoolDescendantsToUpdate._M_t._M_impl.super__Rb_tree_header._M_header;
  mapMemPoolDescendantsToUpdate._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  mapMemPoolDescendantsToUpdate._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  mapMemPoolDescendantsToUpdate._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  mapMemPoolDescendantsToUpdate._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       mapMemPoolDescendantsToUpdate._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::set<uint256,std::less<uint256>,std::allocator<uint256>>::
  set<__gnu_cxx::__normal_iterator<uint256_const*,std::vector<uint256,std::allocator<uint256>>>>
            ((set<uint256,std::less<uint256>,std::allocator<uint256>> *)&setAlreadyIncluded,
             (vHashesToUpdate->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (vHashesToUpdate->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.
             super__Vector_impl_data._M_finish);
  descendants_to_remove._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &descendants_to_remove._M_t._M_impl.super__Rb_tree_header._M_header;
  descendants_to_remove._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  descendants_to_remove._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  descendants_to_remove._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  puVar2 = (vHashesToUpdate->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.
           super__Vector_impl_data._M_start;
  k_00 = (vHashesToUpdate->super__Vector_base<uint256,_std::allocator<uint256>_>)._M_impl.
         super__Vector_impl_data._M_finish;
  this_00 = &(this->mapTx).super_type;
  descendants_to_remove._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       descendants_to_remove._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    do {
      if (k_00 == puVar2) {
        for (p_Var6 = descendants_to_remove._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var6 != &descendants_to_remove._M_t._M_impl.super__Rb_tree_header;
            p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6)) {
          oVar7 = GetIter(this,(uint256 *)(p_Var6 + 1));
          if (((undefined1  [16])
               oVar7.
               super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
               ._M_payload.
               super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
              & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            removeRecursive(this,*(CTransaction **)
                                  oVar7.
                                  super__Optional_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>,_true,_true>
                                  ._M_payload.
                                  super__Optional_payload_base<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>_>
                                  ._M_payload,SIZELIMIT);
          }
        }
        std::
        _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
        ::~_Rb_tree(&descendants_to_remove._M_t);
        std::
        _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
        ::~_Rb_tree(&setAlreadyIncluded._M_t);
        std::_Rb_tree<$3afb3733$>::~_Rb_tree(&mapMemPoolDescendantsToUpdate._M_t);
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          return;
        }
        __stack_chk_fail();
      }
      k_00 = k_00 + -1;
      updateIt = boost::multi_index::detail::
                 hashed_index<mempoolentry_txid,_SaltedTxidHasher,_std::equal_to<uint256>,_boost::multi_index::detail::nth_layer<1,_CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::hashed_unique_tag>
                 ::find<uint256>(this_00,k_00);
    } while (updateIt.node ==
             (this->mapTx).
             super_header_holder<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>_*,_boost::multi_index::multi_index_container<CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>_>
             .member);
    epoch_guard_5.m_epoch = *(Epoch **)(k_00->super_base_blob<256U>).m_data._M_elems;
    iVar4 = indirectmap<COutPoint,_const_CTransaction_*>::lower_bound
                      (&this->mapNextTx,(COutPoint *)&epoch_guard_5);
    Epoch::Guard::Guard(&epoch_guard_5,&this->m_epoch);
    for (; (_Rb_tree_header *)iVar4._M_node !=
           &(this->mapNextTx).m._M_t._M_impl.super__Rb_tree_header;
        iVar4._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar4._M_node)) {
      bVar3 = transaction_identifier<false>::operator==
                        (*(transaction_identifier<false> **)(iVar4._M_node + 1),k_00);
      if (!bVar3) break;
      k = (uint256 *)((long)&iVar4._M_node[1]._M_parent[1]._M_right + 1);
      child = boost::multi_index::detail::
              hashed_index<mempoolentry_txid,_SaltedTxidHasher,_std::equal_to<uint256>,_boost::multi_index::detail::nth_layer<1,_CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>,_boost::mpl::vector0<mpl_::na>,_boost::multi_index::detail::hashed_unique_tag>
              ::find<uint256>(this_00,k);
      if (child.node ==
          (this->mapTx).
          super_header_holder<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>_*,_boost::multi_index::multi_index_container<CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>_>
          .member) {
        __assert_fail("childIter != mapTx.end()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/txmempool.cpp"
                      ,0x8b,
                      "void CTxMemPool::UpdateTransactionsFromBlock(const std::vector<uint256> &)");
      }
      bVar3 = Epoch::visited(&this->m_epoch,
                             (Marker *)
                             ((long)&((child.node)->
                                     super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                                     ).
                                     super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                                     .
                                     super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                                     .
                                     super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                                     .
                                     super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>
                                     .super_pod_value_holder<CTxMemPoolEntry>.space + 0x108));
      if (!bVar3) {
        sVar5 = std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>::count
                          (&setAlreadyIncluded,k);
        if (sVar5 == 0) {
          UpdateChild(this,(txiter)updateIt.node,(txiter)child.node,true);
          UpdateParent(this,(txiter)child.node,(txiter)updateIt.node,true);
        }
      }
    }
    Epoch::Guard::~Guard(&epoch_guard_5);
    UpdateForDescendants
              (this,(txiter)updateIt.node,&mapMemPoolDescendantsToUpdate,&setAlreadyIncluded,
               &descendants_to_remove);
  } while( true );
}

Assistant:

void CTxMemPool::UpdateTransactionsFromBlock(const std::vector<uint256>& vHashesToUpdate)
{
    AssertLockHeld(cs);
    // For each entry in vHashesToUpdate, store the set of in-mempool, but not
    // in-vHashesToUpdate transactions, so that we don't have to recalculate
    // descendants when we come across a previously seen entry.
    cacheMap mapMemPoolDescendantsToUpdate;

    // Use a set for lookups into vHashesToUpdate (these entries are already
    // accounted for in the state of their ancestors)
    std::set<uint256> setAlreadyIncluded(vHashesToUpdate.begin(), vHashesToUpdate.end());

    std::set<uint256> descendants_to_remove;

    // Iterate in reverse, so that whenever we are looking at a transaction
    // we are sure that all in-mempool descendants have already been processed.
    // This maximizes the benefit of the descendant cache and guarantees that
    // CTxMemPoolEntry::m_children will be updated, an assumption made in
    // UpdateForDescendants.
    for (const uint256& hash : vHashesToUpdate | std::views::reverse) {
        // calculate children from mapNextTx
        txiter it = mapTx.find(hash);
        if (it == mapTx.end()) {
            continue;
        }
        auto iter = mapNextTx.lower_bound(COutPoint(Txid::FromUint256(hash), 0));
        // First calculate the children, and update CTxMemPoolEntry::m_children to
        // include them, and update their CTxMemPoolEntry::m_parents to include this tx.
        // we cache the in-mempool children to avoid duplicate updates
        {
            WITH_FRESH_EPOCH(m_epoch);
            for (; iter != mapNextTx.end() && iter->first->hash == hash; ++iter) {
                const uint256 &childHash = iter->second->GetHash();
                txiter childIter = mapTx.find(childHash);
                assert(childIter != mapTx.end());
                // We can skip updating entries we've encountered before or that
                // are in the block (which are already accounted for).
                if (!visited(childIter) && !setAlreadyIncluded.count(childHash)) {
                    UpdateChild(it, childIter, true);
                    UpdateParent(childIter, it, true);
                }
            }
        } // release epoch guard for UpdateForDescendants
        UpdateForDescendants(it, mapMemPoolDescendantsToUpdate, setAlreadyIncluded, descendants_to_remove);
    }

    for (const auto& txid : descendants_to_remove) {
        // This txid may have been removed already in a prior call to removeRecursive.
        // Therefore we ensure it is not yet removed already.
        if (const std::optional<txiter> txiter = GetIter(txid)) {
            removeRecursive((*txiter)->GetTx(), MemPoolRemovalReason::SIZELIMIT);
        }
    }
}